

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum-dtoa.cc
# Opt level: O2

void TestBignumDtoaGayFixed(void)

{
  BignumDtoaMode mode;
  uint uVar1;
  char *expected_source;
  PrecomputedFixed *pPVar2;
  undefined1 condition;
  char *pcVar3;
  int *value;
  ulong uVar4;
  Vector<const_double_conversion::PrecomputedFixed> VVar5;
  Vector<char> buffer;
  Vector<char> representation;
  int point;
  int length;
  ulong local_a0;
  char buffer_container [100];
  int *value_source;
  
  VVar5 = double_conversion::PrecomputedFixedRepresentations();
  pPVar2 = VVar5.start_;
  uVar4 = 0;
  local_a0 = VVar5._8_8_ & 0xffffffff;
  if (VVar5.length_ < 1) {
    local_a0 = uVar4;
  }
  local_a0 = local_a0 << 5;
  for (; local_a0 != uVar4; uVar4 = uVar4 + 0x20) {
    mode = *(BignumDtoaMode *)((long)&pPVar2->number_digits + uVar4);
    expected_source = *(char **)((long)&pPVar2->representation + uVar4);
    uVar1 = *(uint *)((long)&pPVar2->decimal_point + uVar4);
    value_source = &length;
    buffer._8_8_ = value_source;
    buffer.start_ = (char *)0x64;
    value = &point;
    double_conversion::BignumDtoa
              ((double_conversion *)0x2,*(double *)((long)&pPVar2->v + uVar4),mode,
               (int)buffer_container,buffer,&point,(int *)CONCAT44(length,point));
    condition = (undefined1)point;
    CheckEqualsHelper((char *)0x175,0xc0d28f,(char *)(ulong)uVar1,point,(char *)value_source,
                      (int)value);
    pcVar3 = "(number_digits) >= (length - point)";
    CheckHelper((char *)0x176,0xc0d2c6,(char *)(ulong)(length - point <= (int)mode),(bool)condition)
    ;
    representation._8_8_ = pcVar3;
    representation.start_ = buffer_container;
    TrimRepresentation(representation);
    CheckEqualsHelper((char *)0x178,0xc0d2aa,expected_source,buffer_container,(char *)value_source,
                      (char *)value);
  }
  return;
}

Assistant:

TEST(BignumDtoaGayFixed) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;

  Vector<const PrecomputedFixed> precomputed =
      PrecomputedFixedRepresentations();
  for (int i = 0; i < precomputed.length(); ++i) {
    const PrecomputedFixed current_test = precomputed[i];
    double v = current_test.v;
    int number_digits = current_test.number_digits;
    BignumDtoa(v, BIGNUM_DTOA_FIXED, number_digits, buffer, &length, &point);
    CHECK_EQ(current_test.decimal_point, point);
    CHECK_GE(number_digits, length - point);
    TrimRepresentation(buffer);
    CHECK_EQ(current_test.representation, buffer.start());
  }
}